

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID root_id,bool clear_settings_refs)

{
  ImChunkStream<ImGuiWindowSettings> *this;
  ImGuiDockContext *this_00;
  ImGuiID key;
  float fVar1;
  ImGuiContext *ctx;
  ImGuiID *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiWindowSettings *p;
  ImGuiDockNode *pIVar4;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 clear_persistent_docking_ref;
  undefined7 in_register_00000031;
  int i;
  
  pIVar3 = GImGui;
  if ((int)CONCAT71(in_register_00000031,clear_settings_refs) != 0) {
    this = &GImGui->SettingsWindows;
    p = (ImGuiWindowSettings *)(GImGui->SettingsWindows).Buf.Data;
    this_00 = &GImGui->DockContext;
    if (p != (ImGuiWindowSettings *)0x0) {
      p = (ImGuiWindowSettings *)&p->Pos;
    }
    for (; p != (ImGuiWindowSettings *)0x0;
        p = ImChunkStream<ImGuiWindowSettings>::next_chunk(this,p)) {
      if (((root_id == 0) || (key = p->DockId, key == root_id)) ||
         ((key != 0 &&
          ((pIVar4 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&this_00->Nodes,key),
           pIVar4 != (ImGuiDockNode *)0x0 &&
           (pIVar4 = DockNodeGetRootNode(pIVar4), pIVar4->ID == root_id)))))) {
        p->DockId = 0;
      }
    }
  }
  i = 0;
  do {
    if ((pIVar3->Windows).Size <= i) {
      return;
    }
    pIVar4 = (ImGuiDockNode *)ImVector<ImGuiWindow_*>::operator[](&pIVar3->Windows,i);
    ctx = *(ImGuiContext **)pIVar4;
    clear_persistent_docking_ref = extraout_DL;
    if (((root_id == 0) ||
        ((*(long *)&(ctx->IO).MouseDragMaxDistanceAbs[1].y != 0 &&
         (pIVar4 = DockNodeGetRootNode(pIVar4), clear_persistent_docking_ref = extraout_DL_00,
         pIVar4->ID == root_id)))) ||
       ((pIVar2 = *(ImGuiID **)&(ctx->IO).MouseDragMaxDistanceAbs[2].y, pIVar2 != (ImGuiID *)0x0 &&
        (*pIVar2 == root_id)))) {
      fVar1 = (ctx->IO).MouseDragMaxDistanceAbs[3].y;
      DockContextProcessUndockWindow
                (ctx,(ImGuiWindow *)(ulong)clear_settings_refs,(bool)clear_persistent_docking_ref);
      if ((!clear_settings_refs) && ((ctx->IO).MouseDragMaxDistanceAbs[3].y != fVar1)) {
        __assert_fail("window->DockId == backup_dock_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x391d,"void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID, bool)");
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID root_id, bool clear_settings_refs)
{
    // Clear references in settings
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    if (clear_settings_refs)
    {
        for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        {
            bool want_removal = (root_id == 0) || (settings->DockId == root_id);
            if (!want_removal && settings->DockId != 0)
                if (ImGuiDockNode* node = DockContextFindNodeByID(ctx, settings->DockId))
                    if (DockNodeGetRootNode(node)->ID == root_id)
                        want_removal = true;
            if (want_removal)
                settings->DockId = 0;
        }
    }

    // Clear references in windows
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        bool want_removal = (root_id == 0) || (window->DockNode && DockNodeGetRootNode(window->DockNode)->ID == root_id) || (window->DockNodeAsHost && window->DockNodeAsHost->ID == root_id);
        if (want_removal)
        {
            const ImGuiID backup_dock_id = window->DockId;
            IM_UNUSED(backup_dock_id);
            DockContextProcessUndockWindow(ctx, window, clear_settings_refs);
            if (!clear_settings_refs)
                IM_ASSERT(window->DockId == backup_dock_id);
        }
    }
}